

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
          (AnimatedPerspectiveCameraNode *this,
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          *cameras,BBox1f time_range,string *id)

{
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *in_RSI;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *in_RDI;
  pointer in_XMM0_Qa;
  string *in_stack_ffffffffffffffa8;
  PerspectiveCameraNode *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [40];
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *this_00;
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  PerspectiveCameraNode::PerspectiveCameraNode(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (in_RDI->
  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__AnimatedPerspectiveCameraNode_00605f70
  ;
  in_RDI[7].
  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = in_XMM0_Qa;
  std::
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ::vector(this_00,in_RSI);
  return;
}

Assistant:

AnimatedPerspectiveCameraNode (std::vector<Ref<PerspectiveCameraNode>>&& cameras, BBox1f time_range, const std::string& id = "")
        : time_range(time_range), cameras(cameras) {}